

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.cpp
# Opt level: O0

void __thiscall
RTree::k_NN_DF(RTree *this,Point q,int k,vector<d_leaf_*,_std::allocator<d_leaf_*>_> *L)

{
  float local_44;
  undefined1 local_40 [4];
  float poor;
  vector<float,_std::allocator<float>_> dk;
  vector<d_leaf_*,_std::allocator<d_leaf_*>_> *L_local;
  int k_local;
  RTree *this_local;
  Point q_local;
  
  dk.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)L;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_40);
  local_44 = std::numeric_limits<float>::max();
  if (this->root != (RTree_node *)0x0) {
    DFT_recursive(this,q,k,this->root,
                  (vector<d_leaf_*,_std::allocator<d_leaf_*>_> *)
                  dk.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                  (vector<float,_std::allocator<float>_> *)local_40,&local_44);
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_40);
  return;
}

Assistant:

void RTree::k_NN_DF(Point q, int k, std::vector<d_leaf*> &L){
    std::vector<float> dk;
    float poor = std::numeric_limits<float>::max();
    
    if(this->root != nullptr)
        DFT_recursive(q, k, this->root,L,dk,poor);
}